

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

wchar_t object_value_real(object *obj,wchar_t qty)

{
  object_kind *poVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  wchar_t wVar5;
  obj_property *prop_00;
  obj_property *poVar6;
  char *pcVar7;
  int local_6c;
  wchar_t charges;
  object_kind *kind;
  int iStack_58;
  _Bool reduce_bonus;
  wchar_t k;
  int32_t bonus_1;
  wchar_t div_1;
  wchar_t mult_1;
  int32_t bonus;
  wchar_t div;
  wchar_t mult;
  wchar_t amount;
  wchar_t idx;
  obj_property *prop;
  int local_28;
  wchar_t j;
  wchar_t i;
  wchar_t total_value;
  wchar_t value;
  wchar_t qty_local;
  object *obj_local;
  
  _Var3 = tval_has_variable_power(obj);
  if (_Var3) {
    i = obj->kind->cost;
    for (local_28 = 1; local_28 < (int)(uint)z_info->property_max; local_28 = local_28 + 1) {
      prop_00 = obj_properties + local_28;
      wVar5 = prop_00->index;
      _Var3 = object_has_property(obj,prop_00);
      if (_Var3) {
        switch(prop_00->type) {
        case L'\x01':
        case L'\x02':
          wVar5 = property_cost(prop_00,(int)obj->modifiers[wVar5],true);
          i = wVar5 + i;
          break;
        case L'\x03':
          wVar5 = property_cost(prop_00,L'\0',true);
          i = wVar5 + i;
          break;
        case L'\x04':
          wVar5 = property_cost(prop_00,L'd' - obj->el_info[wVar5].res_level,true);
          i = wVar5 + i;
          break;
        case L'\x05':
          wVar5 = property_cost(prop_00,L'\0',true);
          i = wVar5 + i;
          break;
        case L'\x06':
          for (prop._4_4_ = L'\0'; prop._4_4_ < (int)(uint)z_info->brand_max;
              prop._4_4_ = prop._4_4_ + L'\x01') {
            if (((obj->brands[prop._4_4_] & 1U) != 0) &&
               (poVar6 = brand_property(prop._4_4_), prop_00 == poVar6)) {
              wVar5 = brands[prop._4_4_].multiplier;
              _Var3 = tval_is_ammo(obj);
              iVar4 = 1;
              if (_Var3) {
                iVar4 = 10;
              }
              wVar5 = property_cost(prop_00,wVar5,true);
              div_1 = wVar5 / iVar4;
              _Var3 = tval_is_melee_weapon(obj);
              if ((_Var3) || (iVar4 == 10)) {
                div_1 = ((obj->dd + 1) * (uint)obj->ds * div_1) / 0x18;
              }
              i = div_1 + i;
            }
          }
          break;
        case L'\a':
          for (prop._4_4_ = L'\0'; prop._4_4_ < (int)(uint)z_info->slay_max;
              prop._4_4_ = prop._4_4_ + L'\x01') {
            if (((obj->slays[prop._4_4_] & 1U) != 0) &&
               (poVar6 = slay_property(prop._4_4_), prop_00 == poVar6)) {
              wVar5 = slays[prop._4_4_].multiplier;
              _Var3 = tval_is_ammo(obj);
              iVar4 = 1;
              if (_Var3) {
                iVar4 = 10;
              }
              wVar5 = property_cost(prop_00,wVar5,true);
              iStack_58 = wVar5 / iVar4;
              _Var3 = tval_is_melee_weapon(obj);
              if ((_Var3) || (iVar4 == 10)) {
                iStack_58 = (int)((obj->dd + 1) * (uint)obj->ds * iStack_58) / 0x18;
              }
              if ((obj->brands != (_Bool *)0x0) &&
                 (iVar4 = strcmp(prop_00->name,"slay evil creatures"), iVar4 != 0)) {
                bVar2 = false;
                for (kind._4_4_ = 1; kind._4_4_ < (int)(uint)z_info->brand_max;
                    kind._4_4_ = kind._4_4_ + 1) {
                  if ((((obj->brands[kind._4_4_] & 1U) != 0) &&
                      (pcVar7 = strstr(brands[kind._4_4_].name,"poison brand"),
                      pcVar7 == (char *)0x0)) &&
                     ((pcVar7 = strstr(brands[kind._4_4_].name,"cold brand"), pcVar7 == (char *)0x0
                      || (iVar4 = strcmp(prop_00->name,"slay undead"), iVar4 != 0)))) {
                    bVar2 = true;
                    break;
                  }
                }
                if (bVar2) {
                  iStack_58 = iStack_58 - iStack_58 / 4;
                }
              }
              i = iStack_58 + i;
            }
          }
          break;
        case L'\b':
          poVar1 = obj->kind;
          iVar4 = strcmp(prop_00->name,"enhanced dice");
          if (iVar4 == 0) {
            i = i + ((uint)obj->ds - poVar1->ds) * ((uint)obj->ds - poVar1->ds) * (uint)obj->dd *
                    (uint)obj->dd * 0x10;
          }
          else {
            iVar4 = strcmp(prop_00->name,"extra armor");
            if (iVar4 == 0) {
              wVar5 = property_cost(prop_00,(int)obj->ac - poVar1->ac,true);
              i = wVar5 + i;
            }
            else {
              iVar4 = strcmp(prop_00->name,"armor bonus");
              if (iVar4 == 0) {
                wVar5 = property_cost(prop_00,(int)obj->to_a,true);
                i = wVar5 + i;
              }
              else {
                iVar4 = strcmp(prop_00->name,"skill bonus");
                if (iVar4 == 0) {
                  wVar5 = property_cost(prop_00,(int)obj->to_h - (poVar1->to_h).base,true);
                  _Var3 = tval_is_ammo(obj);
                  iVar4 = 1;
                  if (_Var3) {
                    iVar4 = 0x14;
                  }
                  i = wVar5 / iVar4 + i;
                }
                else {
                  iVar4 = strcmp(prop_00->name,"deadliness bonus");
                  if (iVar4 == 0) {
                    wVar5 = property_cost(prop_00,(int)obj->to_d,true);
                    _Var3 = tval_is_ammo(obj);
                    iVar4 = 1;
                    if (_Var3) {
                      iVar4 = 0x14;
                    }
                    i = wVar5 / iVar4 + i;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (obj->curses != (curse_data *)0x0) {
      for (local_28 = 0; local_28 < (int)(uint)z_info->curse_max; local_28 = local_28 + 1) {
        if (obj->curses[local_28].power != L'\0') {
          wVar5 = object_value_real(curses[local_28].obj,L'\x01');
          i = wVar5 + i;
        }
      }
    }
    j = i;
  }
  else {
    if (obj->artifact == (artifact *)0x0) {
      i = obj->kind->cost;
    }
    else {
      i = obj->artifact->cost;
    }
    if (i == L'\0') {
      return L'\0';
    }
    j = i * qty;
    _Var3 = tval_can_have_charges(obj);
    if (_Var3) {
      local_6c = (obj->pval * qty) / (int)(uint)obj->number;
      if ((obj->pval * qty) % (int)(uint)obj->number != 0) {
        local_6c = local_6c + 1;
      }
      j = (i * local_6c) / 0x14 + j;
    }
    if (j < L'\0') {
      j = L'\0';
    }
  }
  return j;
}

Assistant:

int object_value_real(const struct object *obj, int qty)
{
	int value, total_value = 0;

	/* Wearables and ammo have prices that vary by individual item properties */
	if (tval_has_variable_power(obj)) {
		int i, j;

		/* Base cost */
		value = obj->kind->cost;

		/* Add/subtract value for properties */
		for (i = 1; i < z_info->property_max; i++) {
			struct obj_property *prop =	&obj_properties[i];
			int idx = prop->index;
			if (!object_has_property(obj, prop)) continue;
			switch (prop->type) {
				case OBJ_PROPERTY_STAT :
				case OBJ_PROPERTY_MOD :
				{
					value += property_cost(prop, obj->modifiers[idx], true);
					break;
				}
				case OBJ_PROPERTY_FLAG :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_ELEMENT :
				{
					int amount = RES_LEVEL_BASE - obj->el_info[idx].res_level;
					value += property_cost(prop, amount, true);
					break;
				}
				case OBJ_PROPERTY_IGNORE :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_BRAND :
				{
					for (j = 0; j < z_info->brand_max; j++) {
						if (obj->brands[j] && (prop == brand_property(j))) {
							int mult = brands[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))	{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_SLAY :
				{
					for (j = 0; j < z_info->slay_max; j++) {
						if (obj->slays[j] && (prop == slay_property(j))) {
							int mult = slays[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))
							{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							/* Cheap check for brands with broader applicability
							 * that might reduce the slay's practical value */
							if ((obj->brands) &&
								(!streq(prop->name, "slay evil creatures"))) {
								int k;
								bool reduce_bonus = false;
								for (k = 1; k < z_info->brand_max; k++)
								{
									if (!obj->brands[k]) continue;
									if (strstr(brands[k].name, "poison brand"))
										continue;
									if ((strstr(brands[k].name, "cold brand"))
										&& (streq(prop->name, "slay undead")))
										continue;
									reduce_bonus = true;
									break;
								}
								if (reduce_bonus) bonus -= (bonus / 4);
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_COMBAT :
				{
					struct object_kind *kind = obj->kind;
					if (streq(prop->name, "enhanced dice")) {
						value += (obj->ds - kind->ds) * (obj->ds - kind->ds)
							* obj->dd * obj->dd * 16L;
					} else if (streq(prop->name, "extra armor")) {
						value += property_cost(prop, obj->ac - kind->ac, true);
					} else if (streq(prop->name, "armor bonus")) {
						value += property_cost(prop, obj->to_a, true);
					} else if (streq(prop->name, "skill bonus")) {
						value += property_cost(prop, obj->to_h- kind->to_h.base,
											   true) /
							(tval_is_ammo(obj) ? 20 : 1);
					} else if (streq(prop->name, "deadliness bonus")) {
						value += property_cost(prop, obj->to_d, true) /
							(tval_is_ammo(obj) ? 20 : 1);
					}
					break;
				}
				default : break;
			}
		}

		/* Amend cost for curses */
		if (obj->curses) {
			for (i = 0; i < z_info->curse_max; i++) {
				if (obj->curses[i].power) {
					value += object_value_real(curses[i].obj, 1);
				}
			}
		}

		total_value = value;
	} else {
		/* Base cost */
		if (obj->artifact) {
			value = obj->artifact->cost;
		} else {
			value = obj->kind->cost;
		}

		/* Worthless items */
		if (!value) return (0L);

		/* Account for quantity */
		total_value = value * qty;

		/* Charge-holding devices need special treatment */
		if (tval_can_have_charges(obj)) {
			int charges;

			/* Calculate number of charges, rounded up */
			charges = obj->pval * qty / obj->number;
			if ((obj->pval * qty) % obj->number != 0)
				charges++;

			/* Pay extra for charges, depending on standard number of charges */
			total_value += value * charges / 20;
		}

		/* No negative value */
		if (total_value < 0) total_value = 0;
	}

	/* Return the value */
	return total_value;
}